

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simError.cpp
# Opt level: O3

void initSimError(void)

{
  painCave.errMsg[0] = '\0';
  painCave.isFatal = 0;
  painCave.severity = 1;
  painCave.isEventLoop = 0;
  nChecks = 0;
  worldRank = 0;
  return;
}

Assistant:

void initSimError(void) {
  painCave.errMsg[0]   = '\0';
  painCave.isFatal     = 0;
  painCave.severity    = OPENMD_ERROR;
  painCave.isEventLoop = 0;
  nChecks              = 0;
#ifdef IS_MPI
  MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#else
  worldRank = 0;
#endif
}